

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fxuHeapS.c
# Opt level: O3

void Fxu_HeapSingleMoveDn(Fxu_HeapSingle *p,Fxu_Single *pSingle)

{
  int iVar1;
  int iVar2;
  int iVar3;
  Fxu_Single *pFVar4;
  Fxu_Single **ppFVar5;
  uint uVar6;
  int iVar7;
  Fxu_Single **ppFVar8;
  Fxu_Single **ppFVar9;
  Fxu_Single *pFVar10;
  
  iVar1 = p->nItems;
  pFVar4 = p->pTree[(int)pSingle];
  uVar6 = pFVar4->HNum * 2;
  if ((int)uVar6 <= iVar1) {
    ppFVar8 = p->pTree + (int)pSingle;
    iVar7 = pFVar4->HNum;
    do {
      ppFVar5 = p->pTree;
      ppFVar9 = ppFVar5 + (int)uVar6;
      if ((int)uVar6 < iVar1) {
        iVar2 = (*ppFVar9)->Weight;
        iVar3 = ppFVar5[(int)(uVar6 | 1)]->Weight;
        if ((iVar2 <= pFVar4->Weight) && (iVar3 <= pFVar4->Weight)) {
          return;
        }
        pFVar10 = *ppFVar9;
        if (iVar2 < iVar3) {
          ppFVar9 = ppFVar5 + (int)(uVar6 | 1);
          pFVar10 = ppFVar5[(int)(uVar6 | 1)];
        }
      }
      else {
        pFVar10 = *ppFVar9;
        if ((*ppFVar9)->Weight <= pFVar4->Weight) {
          return;
        }
      }
      *ppFVar8 = pFVar10;
      *ppFVar9 = pFVar4;
      iVar2 = (*ppFVar8)->HNum;
      (*ppFVar8)->HNum = iVar7;
      pFVar4->HNum = iVar2;
      uVar6 = iVar2 * 2;
      ppFVar8 = ppFVar9;
      iVar7 = iVar2;
    } while ((int)uVar6 <= iVar1);
  }
  return;
}

Assistant:

void Fxu_HeapSingleMoveDn( Fxu_HeapSingle * p, Fxu_Single * pSingle )
{
    Fxu_Single ** ppChild1, ** ppChild2, ** ppSingle;
    ppSingle = &FXU_HEAP_SINGLE_CURRENT(p, pSingle);
    while ( FXU_HEAP_SINGLE_CHILD1_EXISTS(p,*ppSingle) )
    { // if Child1 does not exist, Child2 also does not exists

        // get the children
        ppChild1 = &FXU_HEAP_SINGLE_CHILD1(p,*ppSingle);
        if ( FXU_HEAP_SINGLE_CHILD2_EXISTS(p,*ppSingle) )
        {
            ppChild2 = &FXU_HEAP_SINGLE_CHILD2(p,*ppSingle);

            // consider two cases
            if ( FXU_HEAP_SINGLE_WEIGHT(*ppSingle) >= FXU_HEAP_SINGLE_WEIGHT(*ppChild1) &&
                 FXU_HEAP_SINGLE_WEIGHT(*ppSingle) >= FXU_HEAP_SINGLE_WEIGHT(*ppChild2) )
            { // Var is larger than both, skip
                break;
            }
            else
            { // Var is smaller than one of them, then swap it with larger 
                if ( FXU_HEAP_SINGLE_WEIGHT(*ppChild1) >= FXU_HEAP_SINGLE_WEIGHT(*ppChild2) )
                {
                    Fxu_HeapSingleSwap( ppSingle, ppChild1 );
                    // update the pointer
                    ppSingle = ppChild1;
                }
                else
                {
                    Fxu_HeapSingleSwap( ppSingle, ppChild2 );
                    // update the pointer
                    ppSingle = ppChild2;
                }
            }
        }
        else // Child2 does not exist
        {
            // consider two cases
            if ( FXU_HEAP_SINGLE_WEIGHT(*ppSingle) >= FXU_HEAP_SINGLE_WEIGHT(*ppChild1) )
            { // Var is larger than Child1, skip
                break;
            }
            else
            { // Var is smaller than Child1, then swap them
                Fxu_HeapSingleSwap( ppSingle, ppChild1 );
                // update the pointer
                ppSingle = ppChild1;
            }
        }
    }
}